

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

void __thiscall
VertexAttrib64Bit::LimitTest::prepareVertexArrayBuffer(LimitTest *this,_iteration iteration)

{
  GLenum err;
  GLuint vertex;
  GLuint vertex_00;
  uint uVar1;
  vector<double,_std::allocator<double>_> buffer_data;
  attributeConfiguration configuration;
  vector<double,_std::allocator<double>_> local_78;
  attributeConfiguration local_60;
  
  vertex_00 = 0;
  local_60.m_n_attributes_per_group = 0;
  local_60.m_type_names = (GLchar **)0x0;
  local_60.m_vertex_length = 0;
  local_60.m_n_elements = (GLint *)0x0;
  local_60.m_n_rows = (GLint *)0x0;
  local_60.m_n_types = 0;
  getVertexArrayConfiguration(this,iteration,&local_60);
  uVar1 = local_60.m_vertex_length << 10;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&local_78,(ulong)uVar1);
  do {
    setAttributes(this,iteration,&local_60,vertex_00,&local_78);
    vertex_00 = vertex_00 + 1;
  } while (vertex_00 != 0x400);
  (*(this->super_Base).gl.bufferData)
            (0x8892,(ulong)uVar1 << 3,
             local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"BufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x939);
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LimitTest::prepareVertexArrayBuffer(_iteration iteration)
{
	GLuint				   buffer_length = 0;
	attributeConfiguration configuration;

	getVertexArrayConfiguration(iteration, configuration);

	buffer_length = m_n_vertices * configuration.m_vertex_length;

	std::vector<GLdouble> buffer_data;
	buffer_data.resize(buffer_length);

	for (GLuint vertex = 0; vertex < m_n_vertices; ++vertex)
	{
		setAttributes(iteration, configuration, vertex, buffer_data);
	}

	gl.bufferData(GL_ARRAY_BUFFER, buffer_length * sizeof(GLdouble), &buffer_data[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");
}